

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rngFORTRAN_wrap.cxx
# Opt level: O2

void init_rng(int seed)

{
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  
  operator_delete(g_generator,5000);
  this = (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
          *)operator_new(5000);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this,(long)seed);
  g_generator = this;
  return;
}

Assistant:

void init_rng(int seed) {
    delete g_generator;
    g_generator = new std::mt19937(seed);
}